

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::Face,_16UL,_64UL>
* __thiscall
embree::
DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::Face,_16UL,_64UL>
::operator=(DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::Face,_16UL,_64UL>
            *this,DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::Face,_16UL,_64UL>
                  *other)

{
  ulong uVar1;
  ulong uVar2;
  DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::Face,_16UL,_64UL>
  *pDVar3;
  
  pDVar3 = (DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::Face,_16UL,_64UL>
            *)other->data;
  uVar2 = 0;
  do {
    if (0xf < uVar2) {
      DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::vfloat_impl<4>,embree::vfloat_impl<4>>::Face,16ul,64ul>
      ::operator=((DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::vfloat_impl<4>,embree::vfloat_impl<4>>::Face,16ul,64ul>
                   *)&this->data);
    }
    this->data[uVar2] = pDVar3->arr[uVar2];
    uVar2 = uVar2 + 1;
    pDVar3 = (DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::Face,_16UL,_64UL>
              *)other->data;
    uVar1 = 0x40;
    if (pDVar3 == other) {
      uVar1 = 0x10;
    }
  } while (uVar2 < uVar1);
  return this;
}

Assistant:

DynamicStackArray& operator= (const DynamicStackArray& other)
    {
      for (size_t i=0; i<other.size(); i++)
        this->operator[] (i) = other[i];

      return *this;
    }